

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

Index __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::remove_last(Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
              *this)

{
  pointer puVar1;
  undefined1 *puVar2;
  node_ptr plVar3;
  pointer puVar4;
  pointer pIVar5;
  pointer p;
  ulong uVar6;
  pointer puVar7;
  Index IVar8;
  Index IVar9;
  uint uVar10;
  pointer puVar12;
  bool bVar13;
  ulong uVar11;
  
  if (this->nextInsertIndex_ == 0) {
    IVar9 = 0xffffffff;
  }
  else {
    uVar10 = this->nextInsertIndex_ - 1;
    uVar11 = (ulong)uVar10;
    this->nextInsertIndex_ = uVar10;
    pIVar5 = (this->matrix_).
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->matrix_).
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5 >> 3) *
            -0x3333333333333333;
    if (uVar6 < uVar11 || uVar6 - uVar11 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    puVar1 = (this->super_Matrix_dimension_option).dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1[(uint)pIVar5[uVar11].super_Column_dimension_option.dim_] =
         puVar1[(uint)pIVar5[uVar11].super_Column_dimension_option.dim_] - 1;
    puVar4 = (this->super_Matrix_dimension_option).dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while ((puVar12 = puVar1, puVar1 != puVar4 &&
           (puVar7 = puVar4 + -1, puVar12 = puVar4, *puVar7 == 0))) {
      (this->super_Matrix_dimension_option).dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      puVar4 = puVar7;
    }
    (this->super_Matrix_dimension_option).maxDim_ =
         (int)((ulong)((long)puVar12 - (long)puVar1) >> 2) + -1;
    uVar6 = (ulong)this->nextInsertIndex_;
    puVar2 = *(undefined1 **)&pIVar5[uVar6].column_.super_type.data_.root_plus_size_;
    IVar8 = 0xffffffff;
    IVar9 = IVar8;
    if ((Column_support *)puVar2 != &pIVar5[uVar6].column_ && puVar2 != (undefined1 *)0x0) {
      plVar3 = *(node_ptr *)((long)&pIVar5[uVar6].column_.super_type.data_ + 8);
      if (plVar3 == (node_ptr)0x0) {
LAB_00160f25:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, true, true>>::Matrix_column_tag, Type = 1]"
                     );
      }
      IVar9 = *(Index *)&plVar3[1].next_;
      if (((this->
           super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_true,_true>_>_>_>
           ).rowSwapped_ == true) && (bVar13 = IVar9 != 0xffffffff, IVar9 = IVar8, bVar13)) {
        Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>
        ::_orderRows(&this->
                      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options<(Column_types)7,_true,_false,_true,_true,_true>_>_>_>
                    );
        uVar6 = (ulong)this->nextInsertIndex_;
        pIVar5 = (this->matrix_).
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = *(undefined1 **)&pIVar5[uVar6].column_.super_type.data_.root_plus_size_;
        if ((Column_support *)puVar2 != &pIVar5[uVar6].column_ && puVar2 != (undefined1 *)0x0) {
          plVar3 = *(node_ptr *)((long)&pIVar5[uVar6].column_.super_type.data_ + 8);
          if (plVar3 == (node_ptr)0x0) goto LAB_00160f25;
          IVar9 = *(Index *)&plVar3[1].next_;
        }
      }
    }
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::Delete_disposer>
              ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                *)&pIVar5[uVar6].column_,pIVar5 + uVar6);
  }
  return IVar9;
}

Assistant:

inline typename Boundary_matrix<Master_matrix>::Index Boundary_matrix<Master_matrix>::remove_last()
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_last' is not implemented for the chosen options.");

  if (nextInsertIndex_ == 0) return Master_matrix::template get_null_value<Index>();  // empty matrix
  --nextInsertIndex_;

  //updates dimension max
  if constexpr (activeDimOption) {
    Dim_opt::update_down(matrix_.at(nextInsertIndex_).get_dimension());
  }

  //computes pivot and removes column from matrix_
  ID_index pivot;
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto it = matrix_.find(nextInsertIndex_);
    pivot = it->second.get_pivot();
    if constexpr (activeSwapOption) {
      // if the removed column is positive, the pivot won't change value
      if (Swap_opt::rowSwapped_ && pivot != Master_matrix::template get_null_value<ID_index>()) {
        Swap_opt::_orderRows();
        pivot = it->second.get_pivot();
      }
    }
    matrix_.erase(it);
  } else {
    pivot = matrix_[nextInsertIndex_].get_pivot();
    if constexpr (activeSwapOption) {
      // if the removed column is positive, the pivot won't change value
      if (Swap_opt::rowSwapped_ && pivot != Master_matrix::template get_null_value<ID_index>()) {
        Swap_opt::_orderRows();
        pivot = matrix_[nextInsertIndex_].get_pivot();
      }
    }
    if constexpr (Master_matrix::Option_list::has_row_access) {
      GUDHI_CHECK(nextInsertIndex_ == matrix_.size() - 1,
                  std::logic_error("Boundary_matrix::remove_last - Indexation problem."));
      matrix_.pop_back();
    } else {
      matrix_[nextInsertIndex_].clear();
    }
  }

  erase_empty_row(nextInsertIndex_);  // maximal, so empty

  //updates barcode
  if constexpr (activePairingOption) {
    Pair_opt::_remove_last(nextInsertIndex_);
  }

  return pivot;
}